

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void read_customSec(wasm_reader *wr,module *m)

{
  uint32 uVar1;
  uint uVar2;
  uint64 uVar3;
  custom_segment *pcVar4;
  byte *pbVar5;
  uint data_size;
  custom_segment *cs;
  uint64 sec_size;
  uint64 right_index;
  module *m_local;
  wasm_reader *wr_local;
  
  uVar3 = (*(wr->wr_op).read_uint64_from_leb128)(wr);
  uVar3 = uVar3 + wr->index;
  pcVar4 = (custom_segment *)malloc(0x20);
  m->custom_sec = pcVar4;
  m->custom_segment_count = m->custom_segment_count + 1;
  pcVar4 = m->custom_sec;
  pcVar4->next = m->custom_sec->next;
  uVar1 = (*(wr->wr_op).read_uint32_from_leb128)(wr);
  pcVar4->name_size = uVar1;
  pbVar5 = (byte *)malloc((ulong)(pcVar4->name_size + 1));
  pcVar4->name = pbVar5;
  (*(wr->wr_op).read_string)(wr,pcVar4->name,(uint64_t)pcVar4->name_size);
  uVar2 = (int)uVar3 - (int)wr->index;
  pbVar5 = (byte *)malloc((ulong)uVar2);
  pcVar4->data = pbVar5;
  (*(wr->wr_op).read_N_byte)(wr,pcVar4->data,(uint64_t)uVar2);
  check_index(wr,uVar3,"read custom_segment failure");
  return;
}

Assistant:

void read_customSec(wasm_reader *wr, module *m) {
    uint64 right_index;
    uint64 sec_size = wr->wr_op.read_uint64_from_leb128(wr);
    right_index = sec_size + wr->index;
    m->custom_sec = malloc(sizeof(struct custom_segment));
    m->custom_segment_count++;
    custom_segment *cs = m->custom_sec;
    cs->next = m->custom_sec->next;
    cs->name_size = wr->wr_op.read_uint32_from_leb128(wr);
    cs->name = malloc(cs->name_size + 1);
    wr->wr_op.read_string(wr, cs->name, cs->name_size);
    uint data_size = right_index - wr->index;
    cs->data = malloc(sizeof(byte) * data_size);
    wr->wr_op.read_N_byte(wr, cs->data, data_size);
    check_index(wr, right_index, "read custom_segment failure");
}